

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void EOPLL_forceRefresh(EOPLL *opll)

{
  long lVar1;
  
  if (opll != (EOPLL *)0x0) {
    for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
      set_patch(opll,(int32_t)lVar1,opll->patch_number[lVar1]);
    }
    for (lVar1 = 0xfc; lVar1 != 0x60c; lVar1 = lVar1 + 0x48) {
      opll->reg[lVar1 + -0x30] = 0xff;
    }
  }
  return;
}

Assistant:

void EOPLL_forceRefresh(EOPLL *opll) {
  int i;

  if (opll == NULL)
    return;

  for (i = 0; i < 9; i++) {
    set_patch(opll, i, opll->patch_number[i]);
  }

  for (i = 0; i < 18; i++) {
    request_update(&opll->slot[i], UPDATE_ALL);
  }
}